

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix3f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *result)

{
  pointer pmVar1;
  StreamReader *pSVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  allocator *paVar6;
  char *pcVar7;
  string *msg;
  allocator local_79;
  char nc;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  float local_58;
  char c;
  
  pmVar1 = (result->
           super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>).
      _M_impl.super__Vector_impl_data._M_finish != pmVar1) {
    (result->
    super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>).
    _M_impl.super__Vector_impl_data._M_finish = pmVar1;
  }
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    _nc = (pointer)0x3f800000;
    sStack_70 = 0;
    local_68._M_allocated_capacity = 0x3f800000;
    local_68._8_4_ = 0.0;
    local_68._12_4_ = 0.0;
    local_58 = 1.0;
    bVar3 = ParseMatrix(this,(matrix3f *)&nc);
    if (bVar3) {
      ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
      push_back(result,(value_type *)&nc);
      do {
        bVar3 = Eof(this);
        if (bVar3) goto LAB_002eaf43;
        bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = Char1(this,&c);
        if (!bVar3) {
          return false;
        }
        if (c == sep) {
          bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = LookChar1(this,&nc);
          if (!bVar3) {
            return false;
          }
          iVar4 = 3;
          if (nc != end_symbol) goto LAB_002eae8d;
        }
        else {
LAB_002eae8d:
          if (c != sep) {
            pSVar2 = this->_sr;
            if ((0 < (long)pSVar2->idx_) && (uVar5 = pSVar2->idx_ - 1, uVar5 <= pSVar2->length_)) {
              pSVar2->idx_ = uVar5;
            }
            goto LAB_002eaf43;
          }
          bVar3 = SkipWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          _nc = (pointer)0x3f800000;
          sStack_70 = 0;
          local_68._M_allocated_capacity = 0x3f800000;
          local_68._8_4_ = 0.0;
          local_68._12_4_ = 0.0;
          local_58 = 1.0;
          bVar3 = ParseMatrix(this,(value_type *)&nc);
          iVar4 = 3;
          if (bVar3) {
            ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
            push_back(result,(value_type *)&nc);
            iVar4 = 0;
          }
        }
      } while (iVar4 == 0);
      if (iVar4 == 1) {
        return false;
      }
LAB_002eaf43:
      if ((result->
          super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>)
          ._M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>)
          ._M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar7 = "Empty array.\n";
      msg = (string *)&nc;
      paVar6 = (allocator *)&c;
    }
    else {
      pcVar7 = "Not starting with the value of requested type.\n";
      msg = (string *)&c;
      paVar6 = &local_79;
    }
    ::std::__cxx11::string::string((string *)msg,pcVar7,paVar6);
    PushError(this,msg);
    ::std::__cxx11::string::_M_dispose();
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}